

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O0

double inv_boxcox_eval(double *x,int N,double lambda,double *bxcx)

{
  double dVar1;
  int local_34;
  int i;
  double *bxcx_local;
  double lambda_local;
  int N_local;
  double *x_local;
  
  if ((lambda != 0.0) || (NAN(lambda))) {
    for (local_34 = 0; local_34 < N; local_34 = local_34 + 1) {
      dVar1 = log1p(lambda * x[local_34]);
      dVar1 = exp(dVar1 / lambda);
      bxcx[local_34] = dVar1;
    }
  }
  else {
    for (local_34 = 0; local_34 < N; local_34 = local_34 + 1) {
      dVar1 = exp(x[local_34]);
      bxcx[local_34] = dVar1;
    }
  }
  return (double)x_local;
}

Assistant:

double inv_boxcox_eval(double *x,int N, double lambda,double *bxcx) {
    int i;

    if (lambda == 0) {
        for(i = 0; i < N;++i) {
            bxcx[i] = exp(x[i]);
        }
    } else {
        for(i = 0; i < N;++i) {
            bxcx[i] = exp(log1p(lambda * x[i])/lambda);
        }
    }
}